

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::anon_unknown_0::ReconstructCollectionProperties
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *properties,Collection *coll,string *warn,string *err,
               bool strict_allowedToken_check)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  reference ppVar4;
  size_type sVar5;
  size_type sVar6;
  ostream *poVar7;
  ulong uVar8;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  Attribute *this;
  AttrMeta *pAVar11;
  AttrMeta *pAVar12;
  ExpansionRule *value;
  CollectionInstance *pCVar13;
  Relationship *pRVar14;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  bool local_14c9;
  CollectionInstance *coll_instance_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1478 [39];
  allocator local_1451;
  string local_1450 [32];
  fmt local_1430 [32];
  ostringstream local_1410 [8];
  ostringstream ss_e_5;
  CollectionInstance *coll_instance_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1270 [39];
  allocator local_1249;
  string local_1248 [32];
  string local_1228;
  ostringstream local_1208 [8];
  ostringstream ss_e_4;
  string local_1090;
  undefined1 local_1070 [8];
  ParseResult ret;
  Animatable<bool> local_1040;
  undefined1 local_1018 [8];
  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> includeRoot;
  CollectionInstance *coll_instance_1;
  function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_d78;
  undefined1 local_d58 [8];
  function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d20 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00 [32];
  ostringstream local_ce0 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  string local_b48;
  ExpansionRule local_b24;
  undefined1 local_b20 [8];
  TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> r;
  CollectionInstance *coll_instance;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0 [39];
  allocator local_889;
  string local_888 [32];
  fmt local_868 [32];
  ostringstream local_848 [8];
  ostringstream ss_e_3;
  undefined1 local_6d0 [8];
  string instance_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690 [32];
  ostringstream local_670 [8];
  ostringstream ss_e_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8 [32];
  ostringstream local_4b8 [8];
  ostringstream ss_e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  fmt local_2d8 [32];
  ostringstream local_2b8 [8];
  ostringstream ss_e;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string local_f8 [32];
  undefined1 local_d8 [8];
  string suffix;
  string local_b0 [32];
  reference local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *__range2;
  undefined1 local_68 [8];
  function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ExpansionRuleEnumHandler;
  char *kCollectionPrefix;
  bool strict_allowedToken_check_local;
  string *err_local;
  string *warn_local;
  Collection *coll_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *properties_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *table_local;
  
  ExpansionRuleEnumHandler._M_invoker = (_Invoker_type)anon_var_dwarf_477a8f;
  ::std::
  function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,std::__cxx11::string>(std::__cxx11::string_const&)>
  ::
  function<tinyusdz::prim::(anonymous_namespace)::ReconstructCollectionProperties(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,std::map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>const&,tinyusdz::Collection*,std::__cxx11::string*,std::__cxx11::string*,bool)::__0,void>
            ((function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,std::__cxx11::string>(std::__cxx11::string_const&)>
              *)local_68,(anon_class_1_0_00000001 *)((long)&__range2 + 7));
  if (coll == (Collection *)0x0) {
    table_local._7_1_ = 0;
    __range2._0_4_ = 1;
  }
  else {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      ppVar4 = ::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
               ::operator*(&__end2);
      local_90 = ppVar4;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_b0,"collection:",(allocator *)(suffix.field_2._M_local_buf + 0xf));
      bVar1 = startsWith((string *)ppVar4,(string *)local_b0);
      ::std::__cxx11::string::~string(local_b0);
      ::std::allocator<char>::~allocator((allocator<char> *)(suffix.field_2._M_local_buf + 0xf));
      if ((bVar1) &&
         (sVar5 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(table,&local_90->first), ppVar4 = local_90, sVar5 == 0)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_f8,"collection:",
                   (allocator *)
                   ((long)&names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        removePrefix((tinyusdz *)local_d8,(string *)ppVar4,(string *)local_f8);
        ::std::__cxx11::string::~string(local_f8);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_138,":",&local_139);
        iVar3 = ::std::numeric_limits<int>::max();
        split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118,(string *)local_d8,&local_138,iVar3 / 100);
        ::std::__cxx11::string::~string((string *)&local_138);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_139);
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_118);
        if (sVar6 == 2) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_118,0);
          uVar8 = ::std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_118,1);
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              psVar9 = (string *)
                       ::std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_118,0);
              ::std::__cxx11::string::string((string *)local_6d0,psVar9);
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ::std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_118,1);
              bVar1 = ::std::operator==(pbVar10,"includes");
              if (bVar1) {
                bVar1 = Property::is_relationship(&local_90->second);
                if (bVar1) {
                  pCVar13 = Collection::get_or_add_instance(coll,(string *)local_6d0);
                  pRVar14 = Property::get_relationship(&local_90->second);
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (&pCVar13->includes,pRVar14);
                  pVar15 = ::std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::insert(table,&local_90->first);
                  r._560_8_ = pVar15.first._M_node;
                  goto LAB_002cd4a5;
                }
                ::std::__cxx11::ostringstream::ostringstream(local_848);
                poVar7 = ::std::operator<<((ostream *)local_848,"[error]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReconstructCollectionProperties");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa78);
                ::std::operator<<(poVar7," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string(local_888,"`{}` must be a Relationship",&local_889);
                fmt::format<std::__cxx11::string>
                          (local_868,(string *)local_888,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90);
                poVar7 = ::std::operator<<((ostream *)local_848,(string *)local_868);
                ::std::operator<<(poVar7,"\n");
                ::std::__cxx11::string::~string((string *)local_868);
                ::std::__cxx11::string::~string(local_888);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_889);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_8b0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&coll_instance);
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_8b0);
                  ::std::__cxx11::string::~string((string *)local_8b0);
                  ::std::__cxx11::string::~string((string *)&coll_instance);
                }
                table_local._7_1_ = 0;
                __range2._0_4_ = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_848);
              }
              else {
                pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ::std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_118,1);
                bVar1 = ::std::operator==(pbVar10,"expansionRule");
                if (bVar1) {
                  local_b24 = ExpandPrims;
                  TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::
                  TypedAttributeWithFallback
                            ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                              *)local_b20,&local_b24);
                  _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_90,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_90);
                  if (_Var2) {
                    sVar5 = ::std::
                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::count(table,&local_90->first);
                    if (sVar5 == 0) {
                      Property::value_type_name_abi_cxx11_(&local_b48,&local_90->second);
                      tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                      _Var2 = ::std::operator==(&local_b48,&local_b68);
                      local_14c9 = false;
                      if (_Var2) {
                        bVar1 = Property::is_attribute(&local_90->second);
                        local_14c9 = false;
                        if (bVar1) {
                          local_14c9 = Property::is_empty(&local_90->second);
                        }
                      }
                      ::std::__cxx11::string::~string((string *)&local_b68);
                      ::std::__cxx11::string::~string((string *)&local_b48);
                      if (local_14c9 == false) {
                        fun._M_invoker = (_Invoker_type)Property::get_attribute(&local_90->second);
                        ::std::
                        function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::function((function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)local_d58,
                                   (function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)local_68);
                        ppVar4 = local_90;
                        ::std::
                        function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::function(&local_d78,
                                   (function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)local_d58);
                        bVar1 = ParseUniformEnumProperty<tinyusdz::CollectionInstance::ExpansionRule,tinyusdz::CollectionInstance::ExpansionRule>
                                          ((string *)ppVar4,strict_allowedToken_check,&local_d78,
                                           (Attribute *)fun._M_invoker,
                                           (TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                            *)local_b20,warn,err);
                        ::std::
                        function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::~function(&local_d78);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          pAVar11 = Attribute::metas((Attribute *)fun._M_invoker);
                          pAVar12 = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                    ::metas((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                             *)local_b20);
                          AttrMetas::operator=(pAVar12,pAVar11);
                          ::std::
                          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::insert(table,&local_90->first);
                          __range2._0_4_ = 3;
                        }
                        else {
                          table_local._7_1_ = 0;
                          __range2._0_4_ = 1;
                        }
                        ::std::
                        function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::~function((function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)local_d58);
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_ce0);
                        poVar7 = ::std::operator<<((ostream *)local_ce0,"[warn]");
                        poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar7 = ::std::operator<<(poVar7,":");
                        poVar7 = ::std::operator<<(poVar7,"ReconstructCollectionProperties");
                        poVar7 = ::std::operator<<(poVar7,"():");
                        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa84);
                        ::std::operator<<(poVar7," ");
                        poVar7 = ::std::operator<<((ostream *)local_ce0,"No value assigned to `");
                        poVar7 = ::std::operator<<(poVar7,(string *)local_90);
                        poVar7 = ::std::operator<<(poVar7,
                                                  "` token attribute. Set default token value.");
                        ::std::operator<<(poVar7,"\n");
                        if (warn != (string *)0x0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::operator+(local_d00,local_d20);
                          ::std::__cxx11::string::operator=((string *)warn,(string *)local_d00);
                          ::std::__cxx11::string::~string((string *)local_d00);
                          ::std::__cxx11::string::~string((string *)local_d20);
                        }
                        ::std::__cxx11::ostringstream::~ostringstream(local_ce0);
                        this = Property::get_attribute(&local_90->second);
                        pAVar11 = Attribute::metas(this);
                        pAVar12 = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                  ::metas((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                           *)local_b20);
                        AttrMetas::operator=(pAVar12,pAVar11);
                        ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert(table,&local_90->first);
                        __range2._0_4_ = 3;
                      }
                    }
                    else {
                      __range2._0_4_ = 3;
                    }
                  }
                  else {
                    sVar5 = ::std::
                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::count(table,&local_90->first);
                    if (sVar5 != 0) {
                      includeRoot._640_8_ =
                           Collection::get_or_add_instance(coll,(string *)local_6d0);
                      value = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                              ::get_value((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                           *)local_b20);
                      TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::
                      operator=((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                                 *)includeRoot._640_8_,value);
                    }
                    __range2._0_4_ = 0;
                  }
                  TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::
                  ~TypedAttributeWithFallback
                            ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                              *)local_b20);
                }
                else {
                  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ::std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_118,1);
                  bVar1 = ::std::operator==(pbVar10,"includeRoot");
                  if (!bVar1) {
                    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ::std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)local_118,1);
                    bVar1 = ::std::operator==(pbVar10,"excludes");
                    if (bVar1) {
                      bVar1 = Property::is_relationship(&local_90->second);
                      if (!bVar1) {
                        ::std::__cxx11::ostringstream::ostringstream(local_1410);
                        poVar7 = ::std::operator<<((ostream *)local_1410,"[error]");
                        poVar7 = ::std::operator<<(poVar7,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar7 = ::std::operator<<(poVar7,":");
                        poVar7 = ::std::operator<<(poVar7,"ReconstructCollectionProperties");
                        poVar7 = ::std::operator<<(poVar7,"():");
                        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa96);
                        ::std::operator<<(poVar7," ");
                        ::std::allocator<char>::allocator();
                        ::std::__cxx11::string::string
                                  (local_1450,"`{}` must be a Relationship",&local_1451);
                        fmt::format<std::__cxx11::string>
                                  (local_1430,(string *)local_1450,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_90);
                        poVar7 = ::std::operator<<((ostream *)local_1410,(string *)local_1430);
                        ::std::operator<<(poVar7,"\n");
                        ::std::__cxx11::string::~string((string *)local_1430);
                        ::std::__cxx11::string::~string(local_1450);
                        ::std::allocator<char>::~allocator((allocator<char> *)&local_1451);
                        if (err != (string *)0x0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::operator+(local_1478,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&coll_instance_3);
                          ::std::__cxx11::string::operator=((string *)err,(string *)local_1478);
                          ::std::__cxx11::string::~string((string *)local_1478);
                          ::std::__cxx11::string::~string((string *)&coll_instance_3);
                        }
                        table_local._7_1_ = 0;
                        __range2._0_4_ = 1;
                        ::std::__cxx11::ostringstream::~ostringstream(local_1410);
                        goto LAB_002cd4ac;
                      }
                      pCVar13 = Collection::get_or_add_instance(coll,(string *)local_6d0);
                      pRVar14 = Property::get_relationship(&local_90->second);
                      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                                (&pCVar13->excludes,pRVar14);
                      ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert(table,&local_90->first);
                    }
                    goto LAB_002cd4a5;
                  }
                  ret.err.field_2._M_local_buf[0xf] = '\0';
                  Animatable<bool>::Animatable
                            (&local_1040,(bool *)(ret.err.field_2._M_local_buf + 0xf));
                  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::
                  TypedAttributeWithFallback
                            ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)local_1018,
                             &local_1040);
                  Animatable<bool>::~Animatable(&local_1040);
                  ::std::__cxx11::string::string((string *)&local_1090,(string *)local_90);
                  ppVar4 = local_90;
                  ParseTypedAttribute<bool>
                            ((ParseResult *)local_1070,table,&local_1090,&local_90->second,
                             (string *)local_90,
                             (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)local_1018);
                  ::std::__cxx11::string::~string((string *)&local_1090);
                  if (((local_1070._0_4_ == Success) || (local_1070._0_4_ == AlreadyProcessed)) ||
                     (local_1070._0_4_ == Unmatched)) {
                    __range2._0_4_ = 0;
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_1208);
                    poVar7 = ::std::operator<<((ostream *)local_1208,"[error]");
                    poVar7 = ::std::operator<<(poVar7,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                              );
                    poVar7 = ::std::operator<<(poVar7,":");
                    poVar7 = ::std::operator<<(poVar7,"ReconstructCollectionProperties");
                    poVar7 = ::std::operator<<(poVar7,"():");
                    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa8d);
                    ::std::operator<<(poVar7," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_1248,"Parsing attribute `{}` failed. Error: {}",&local_1249);
                    fmt::format<std::__cxx11::string,std::__cxx11::string>
                              (&local_1228,(fmt *)local_1248,(string *)local_90,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ppVar4);
                    poVar7 = ::std::operator<<((ostream *)local_1208,(string *)&local_1228);
                    ::std::operator<<(poVar7,"\n");
                    ::std::__cxx11::string::~string((string *)&local_1228);
                    ::std::__cxx11::string::~string(local_1248);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1249);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::operator+(local_1270,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&coll_instance_2);
                      ::std::__cxx11::string::operator=((string *)err,(string *)local_1270);
                      ::std::__cxx11::string::~string((string *)local_1270);
                      ::std::__cxx11::string::~string((string *)&coll_instance_2);
                    }
                    table_local._7_1_ = 0;
                    __range2._0_4_ = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_1208);
                  }
                  ParseResult::~ParseResult((ParseResult *)local_1070);
                  if ((int)__range2 == 0) {
                    sVar5 = ::std::
                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::count(table,&local_90->first);
                    if (sVar5 != 0) {
                      pCVar13 = Collection::get_or_add_instance(coll,(string *)local_6d0);
                      TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::operator=
                                (&pCVar13->includeRoot,
                                 (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)
                                 local_1018);
                    }
                    __range2._0_4_ = 0;
                  }
                  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::
                  ~TypedAttributeWithFallback
                            ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)local_1018);
                }
                if ((int)__range2 == 0) {
LAB_002cd4a5:
                  __range2._0_4_ = 0;
                }
              }
LAB_002cd4ac:
              ::std::__cxx11::string::~string((string *)local_6d0);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_670);
              poVar7 = ::std::operator<<((ostream *)local_670,"[error]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructCollectionProperties");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa70);
              ::std::operator<<(poVar7," ");
              poVar7 = ::std::operator<<((ostream *)local_670,"Collection property name is empty");
              ::std::operator<<(poVar7,"\n");
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_690,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(instance_name.field_2._M_local_buf + 8));
                ::std::__cxx11::string::operator=((string *)err,(string *)local_690);
                ::std::__cxx11::string::~string((string *)local_690);
                ::std::__cxx11::string::~string((string *)(instance_name.field_2._M_local_buf + 8));
              }
              table_local._7_1_ = 0;
              __range2._0_4_ = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_670);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_4b8);
            poVar7 = ::std::operator<<((ostream *)local_4b8,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructCollectionProperties");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa6d);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_4b8,
                                       "INSTANCE_NAME is empty for collection property name");
            ::std::operator<<(poVar7,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_4d8,local_4f8);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_4d8);
              ::std::__cxx11::string::~string((string *)local_4d8);
              ::std::__cxx11::string::~string((string *)local_4f8);
            }
            table_local._7_1_ = 0;
            __range2._0_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_4b8);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_2b8);
          poVar7 = ::std::operator<<((ostream *)local_2b8,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructCollectionProperties");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xa6a);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_2f8,
                     "Invalid collection property name. Must be \'collection:INSTANCE_NAME:<prop_name>\' but got \'{}\'"
                     ,&local_2f9);
          fmt::format<std::__cxx11::string>
                    (local_2d8,(string *)local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
          poVar7 = ::std::operator<<((ostream *)local_2b8,(string *)local_2d8);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)local_2d8);
          ::std::__cxx11::string::~string(local_2f8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_320,local_340);
            ::std::__cxx11::string::operator=((string *)err,(string *)local_320);
            ::std::__cxx11::string::~string((string *)local_320);
            ::std::__cxx11::string::~string((string *)local_340);
          }
          table_local._7_1_ = 0;
          __range2._0_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_2b8);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_118);
        ::std::__cxx11::string::~string((string *)local_d8);
        if (((int)__range2 != 0) && ((int)__range2 != 3)) goto LAB_002cd509;
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    table_local._7_1_ = 1;
    __range2._0_4_ = 1;
  }
LAB_002cd509:
  ::std::
  function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<nonstd::expected_lite::expected<tinyusdz::CollectionInstance::ExpansionRule,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)local_68);
  return (bool)(table_local._7_1_ & 1);
}

Assistant:

bool ReconstructCollectionProperties(
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  Collection *coll, /* inout */
  std::string *warn,
  std::string *err,
  bool strict_allowedToken_check)
{
  constexpr auto kCollectionPrefix = "collection:";

  std::function<nonstd::expected<CollectionInstance::ExpansionRule, std::string>(const std::string &)> ExpansionRuleEnumHandler = [](const std::string &tok) {
  //auto ExpansionRuleEnumHandler = [](const std::string &tok) {
    using EnumTy = std::pair<CollectionInstance::ExpansionRule, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(CollectionInstance::ExpansionRule::ExplicitOnly, kExplicitOnly),
        std::make_pair(CollectionInstance::ExpansionRule::ExpandPrims, kExpandPrims),
        std::make_pair(CollectionInstance::ExpansionRule::ExpandPrimsAndProperties, kExpandPrimsAndProperties),
    };
    return EnumHandler<CollectionInstance::ExpansionRule>("expansionRule", tok, enums);
  };

  if (!coll) {
    return false;
  }

  for (const auto &prop : properties) {
    if (startsWith(prop.first, kCollectionPrefix)) {
      if (table.count(prop.first)) {
         continue;
      }

      std::string suffix = removePrefix(prop.first, kCollectionPrefix);
      std::vector<std::string> names = split(suffix, ":");
      if (names.size() != 2) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid collection property name. Must be 'collection:INSTANCE_NAME:<prop_name>' but got '{}'",  prop.first));
      }
      if (names[0].empty()) {
        PUSH_ERROR_AND_RETURN("INSTANCE_NAME is empty for collection property name");
      }
      if (names[1].empty()) {
        PUSH_ERROR_AND_RETURN("Collection property name is empty");
      }

      std::string instance_name = names[0];

      if (names[1] == "includes") {

        if (!prop.second.is_relationship()) {
          PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
        }

        CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
        coll_instance.includes = prop.second.get_relationship();
        table.insert(prop.first);

      } else if (names[1] == "expansionRule") {

        TypedAttributeWithFallback<CollectionInstance::ExpansionRule> r{CollectionInstance::ExpansionRule::ExpandPrims};

        PARSE_UNIFORM_ENUM_PROPERTY(table, prop, prop.first, CollectionInstance::ExpansionRule, ExpansionRuleEnumHandler, CollectionInstance,
                       r, strict_allowedToken_check)

        if (table.count(prop.first)) {
          CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
          coll_instance.expansionRule = r.get_value();
        }
      } else if (names[1] == "includeRoot") {

        TypedAttributeWithFallback<Animatable<bool>> includeRoot{false};
        PARSE_TYPED_ATTRIBUTE_NOCONTINUE(table, prop, prop.first, CollectionInstance, includeRoot)

        if (table.count(prop.first)) {
          CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
          coll_instance.includeRoot = includeRoot;
        }
      } else if (names[1] == "excludes") {

        if (!prop.second.is_relationship()) {
          PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
        }

        CollectionInstance &coll_instance = coll->get_or_add_instance(instance_name);
        coll_instance.excludes = prop.second.get_relationship();
        table.insert(prop.first);

      }
    }
  }

  return true;
}